

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O3

CEPlanet * CEPlanet::Neptune(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Neptune",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  SetSemiMajorAxis_AU(in_RDI,30.06952752,6.447e-05);
  SetEccentricity(in_RDI,0.00895439,8.18e-06);
  SetInclination(in_RDI,1.7700552,0.000224,DEGREES);
  SetMeanLongitude(in_RDI,304.22289287,218.46515314,DEGREES);
  SetPerihelionLongitude(in_RDI,46.68158724,0.01009938,DEGREES);
  SetAscendingNodeLongitude(in_RDI,131.78635853,-0.00606302,DEGREES);
  SetExtraTerms(in_RDI,-0.00041348,0.68346318,-0.10162547,7.67025);
  SetMeanRadius_m(in_RDI,24624000.0);
  SetAlbedo(in_RDI,0.41);
  SetMass_kg(in_RDI,1.0241e+26);
  local_40._M_dataplus._M_p = (pointer)0x4020000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Neptune()
{
    CEPlanet neptune("Neptune", 0.0, 0.0) ;
    neptune.SetSemiMajorAxis_AU(30.06952752, 0.00006447) ;
    neptune.SetEccentricity(0.00895439, 0.00000818) ;
    neptune.SetInclination(1.77005520, 0.00022400, CEAngleType::DEGREES) ;
    neptune.SetMeanLongitude(304.22289287, 218.46515314, CEAngleType::DEGREES) ;
    neptune.SetPerihelionLongitude(46.68158724, 0.01009938, CEAngleType::DEGREES) ;
    neptune.SetAscendingNodeLongitude(131.78635853, -0.00606302, CEAngleType::DEGREES) ;
    
    neptune.SetExtraTerms(-0.00041348, 0.68346318, -0.10162547, 7.67025000) ;
    
    // Set planetary properties
    neptune.SetMeanRadius_m(24624000.0) ;
    neptune.SetAlbedo(0.41) ;
    neptune.SetMass_kg(1.0241E26) ;
    
    // Set the sofa planet ID
    neptune.SetSofaID(8) ;
    
    return neptune ;
}